

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_ObjAddCutToStore(Mpm_Man_t *p,Mpm_Cut_t *pCut,int ArrTime)

{
  int iVar1;
  Mpm_Uni_t *pMVar2;
  Mpm_Uni_t *pMVar3;
  int local_44;
  int local_40;
  int last;
  int iPivot;
  int k;
  Mpm_Uni_t *pUnitNew;
  Mpm_Uni_t *pUnit;
  int fEnableContainment;
  int ArrTime_local;
  Mpm_Cut_t *pCut_local;
  Mpm_Man_t *p_local;
  
  pMVar2 = Mpm_CutSetupInfo(p,pCut,ArrTime);
  if (p->nCutStore == 0) {
    iVar1 = p->nCutStore;
    p->nCutStore = iVar1 + 1;
    p->pCutStore[iVar1] = pMVar2;
    Vec_PtrPop(&p->vFreeUnits);
    p_local._4_4_ = 1;
  }
  else if ((p->nCutStore == p->nNumCuts + -1) &&
          (iVar1 = (*p->pCutCmp)(pMVar2,p->pCutStore[p->nCutStore + -1]), 0 < iVar1)) {
    p_local._4_4_ = 0;
  }
  else {
    if (p->nNumCuts < p->nCutStore) {
      __assert_fail("p->nCutStore <= p->nNumCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0xfb,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
    local_40 = p->nCutStore;
    do {
      local_40 = local_40 + -1;
      if (local_40 < 0) break;
      iVar1 = (*p->pCutCmp)(pMVar2,p->pCutStore[local_40]);
    } while (iVar1 < 1);
    for (last = 0; last <= local_40; last = last + 1) {
      pMVar3 = p->pCutStore[last];
      if (((*(uint *)&(pMVar3->pCut).field_0x4 >> 0x1b <= *(uint *)&(pMVar2->pCut).field_0x4 >> 0x1b
           ) && ((pMVar2->uSign & pMVar3->uSign) == pMVar3->uSign)) &&
         (iVar1 = Mpm_CutIsContained(p,&pMVar2->pCut,&pMVar3->pCut), iVar1 != 0)) {
        return 0;
      }
    }
    if (((*(uint *)&(p->pCutStore[0]->pCut).field_0x4 >> 0x1a & 1) != 0) &&
       ((*(uint *)&(pMVar2->pCut).field_0x4 >> 0x1a & 1) == 0)) {
      local_40 = -1;
    }
    pMVar3 = (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits);
    if (pMVar2 != pMVar3) {
      __assert_fail("pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x11a,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
    Vec_PtrPop(&p->vFreeUnits);
    last = p->nCutStore;
    p->nCutStore = last + 1;
    for (; local_40 + 1 < last; last = last + -1) {
      p->pCutStore[last] = p->pCutStore[last + -1];
    }
    p->pCutStore[local_40 + 1] = pMVar2;
    local_44 = local_40 + 2;
    for (last = local_44; last < p->nCutStore; last = last + 1) {
      pMVar3 = p->pCutStore[last];
      if (((*(uint *)&(pMVar3->pCut).field_0x4 >> 0x1b < *(uint *)&(pMVar2->pCut).field_0x4 >> 0x1b)
          || ((pMVar2->uSign & pMVar3->uSign) != pMVar2->uSign)) ||
         (iVar1 = Mpm_CutIsContained(p,&pMVar3->pCut,&pMVar2->pCut), iVar1 == 0)) {
        p->pCutStore[local_44] = p->pCutStore[last];
        local_44 = local_44 + 1;
      }
      else {
        Vec_PtrPush(&p->vFreeUnits,pMVar3);
      }
    }
    p->nCutStore = local_44;
    if (p->nCutStore == p->nNumCuts) {
      iVar1 = p->nCutStore + -1;
      p->nCutStore = iVar1;
      Vec_PtrPush(&p->vFreeUnits,p->pCutStore[iVar1]);
    }
    if (p->nNumCuts <= p->nCutStore) {
      __assert_fail("p->nCutStore < p->nNumCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x13b,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Mpm_ObjAddCutToStore( Mpm_Man_t * p, Mpm_Cut_t * pCut, int ArrTime )
{
    int fEnableContainment = 1;
    Mpm_Uni_t * pUnit, * pUnitNew;
    int k, iPivot, last;
    // create new unit
#ifdef MIG_RUNTIME
    abctime clk;
clk = Abc_Clock();
#endif
    pUnitNew = Mpm_CutSetupInfo( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeEval += Abc_Clock() - clk;
#endif
    // special case when the cut store is empty
    if ( p->nCutStore == 0 )
    {
        p->pCutStore[p->nCutStore++] = pUnitNew;
        Vec_PtrPop( &p->vFreeUnits );
        return 1;
    }
    // special case when the cut store is full and last cut is better than new cut
    if ( p->nCutStore == p->nNumCuts-1 && p->pCutCmp(pUnitNew, p->pCutStore[p->nCutStore-1]) > 0 )
        return 0;

    // find place of the given cut in the store
    assert( p->nCutStore <= p->nNumCuts );
    for ( iPivot = p->nCutStore - 1; iPivot >= 0; iPivot-- )
        if ( p->pCutCmp(pUnitNew, p->pCutStore[iPivot]) > 0 ) // iPivot-th cut is better than new cut
            break;

    if ( fEnableContainment )
    {
#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
        // filter this cut using other cuts
        for ( k = 0; k <= iPivot; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves >= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnit->uSign && 
                 Mpm_CutIsContained(p, &pUnitNew->pCut, &pUnit->pCut) )
            {
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
                return 0;
            }
        }
    }

    // special case when the best cut is useless while the new cut is not
    if ( p->pCutStore[0]->pCut.fUseless && !pUnitNew->pCut.fUseless )
        iPivot = -1;

    // add the cut to storage
    assert( pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits) );
    Vec_PtrPop( &p->vFreeUnits );

    // insert this cut at location iPivot
    iPivot++;
    for ( k = p->nCutStore++; k > iPivot; k-- )
        p->pCutStore[k] = p->pCutStore[k-1];
    p->pCutStore[iPivot] = pUnitNew;

    if ( fEnableContainment )
    {
        // filter other cuts using this cut
        for ( k = last = iPivot+1; k < p->nCutStore; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves <= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnitNew->uSign && 
                 Mpm_CutIsContained(p, &pUnit->pCut, &pUnitNew->pCut) )
            {
                Vec_PtrPush( &p->vFreeUnits, pUnit );
                continue;
            }
            p->pCutStore[last++] = p->pCutStore[k];
        }
        p->nCutStore = last;
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
    }

    // remove the last cut if too many
    if ( p->nCutStore == p->nNumCuts )
        Vec_PtrPush( &p->vFreeUnits, p->pCutStore[--p->nCutStore] );
    assert( p->nCutStore < p->nNumCuts );
    return 1;
}